

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

void __thiscall despot::POMDPX::InitTransitions(POMDPX *this)

{
  int iVar1;
  int iVar2;
  int _state_id;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference this_00;
  log_ostream *plVar6;
  ostream *poVar7;
  double dVar8;
  double dVar9;
  State local_98;
  reference local_78;
  pair<std::vector<int,_std::allocator<int>_>,_double> *pair;
  undefined1 local_68 [4];
  int i;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  best;
  int a;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> state;
  int s;
  int num_actions;
  int num_states;
  double start;
  POMDPX *this_local;
  
  if ((this->is_small_ & 1U) != 0) {
    dVar8 = get_time_second();
    iVar1 = (*(this->super_MDP)._vptr_MDP[2])();
    iVar2 = (*(this->super_MDP)._vptr_MDP[3])();
    std::
    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
    ::resize(&this->transition_probabilities_,(long)iVar1);
    for (state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < iVar1;
        state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      Parser::ComputeState
                ((vector<int,_std::allocator<int>_> *)local_40,this->parser_,
                 state.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage._4_4_);
      pvVar3 = std::
               vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               ::operator[](&this->transition_probabilities_,
                            (long)state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage._4_4_);
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize(pvVar3,(long)iVar2);
      for (best.
           super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          (int)best.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < iVar2;
          best.
          super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)best.
                    super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        Parser::ComputeTopTransitions
                  ((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    *)local_68,this->parser_,(vector<int,_std::allocator<int>_> *)local_40,
                   (int)best.
                        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (int)(500000 / (long)iVar1));
        for (pair._4_4_ = 0; uVar4 = (ulong)pair._4_4_,
            sVar5 = std::
                    vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                    ::size((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                            *)local_68), uVar4 < sVar5; pair._4_4_ = pair._4_4_ + 1) {
          local_78 = std::
                     vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                     ::operator[]((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                   *)local_68,(long)pair._4_4_);
          pvVar3 = std::
                   vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                   ::operator[](&this->transition_probabilities_,
                                (long)state.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage._4_4_);
          this_00 = std::
                    vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ::operator[](pvVar3,(long)(int)best.
                                                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                );
          _state_id = Parser::ComputeIndex(this->parser_,&local_78->first);
          State::State(&local_98,_state_id,local_78->second);
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back(this_00,&local_98);
          State::~State(&local_98);
        }
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ::~vector((vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                   *)local_68);
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40)
      ;
    }
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 2 < iVar1)) {
      plVar6 = logging::stream(3);
      poVar7 = std::operator<<(&plVar6->super_ostream,
                               "[POMDPX::InitTransitions] Initialized transition table in ");
      dVar9 = get_time_second();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar9 - dVar8);
      poVar7 = std::operator<<(poVar7,"s.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x139,"void despot::POMDPX::InitTransitions()");
}

Assistant:

void POMDPX::InitTransitions() {
	assert(is_small_);

	double start = get_time_second();
	int num_states = NumStates(), num_actions = NumActions();
	transition_probabilities_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		vector<int> state = parser_->ComputeState(s);
		transition_probabilities_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			vector<pair<vector<int>, double> > best =
				parser_->ComputeTopTransitions(state, a, 500000 / num_states);
			for (int i = 0; i < best.size(); i++) {
				const pair<vector<int>, double>& pair = best[i];
				transition_probabilities_[s][a].push_back(
					State(parser_->ComputeIndex(pair.first), pair.second));
			}
		}
	}
	logi << "[POMDPX::InitTransitions] Initialized transition table in "
		<< (get_time_second() - start) << "s." << endl;
}